

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::write<char,fmt::v8::appender>
                   (appender out,char value,basic_format_specs<char> *specs,locale_ref loc)

{
  locale_ref loc_00;
  bool bVar1;
  write_int_arg<unsigned_int> in_RCX;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_RDX;
  undefined1 in_SIL;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_RDI;
  basic_format_specs<char> *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff97;
  undefined7 in_stack_ffffffffffffffa0;
  undefined8 local_48;
  
  bVar1 = check_char_specs<char,fmt::v8::detail::error_handler>
                    (in_stack_ffffffffffffff78,(error_handler *)0x1b603c);
  if (bVar1) {
    local_48 = (buffer<char> *)
               write_char<char,fmt::v8::appender>
                         (in_RDX.container,in_stack_ffffffffffffff97,in_RDI.container);
  }
  else {
    make_write_int_arg<int>
              ((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(sign_t)in_stack_ffffffffffffff88);
    loc_00.locale_._7_1_ = in_SIL;
    loc_00.locale_._0_7_ = in_stack_ffffffffffffffa0;
    local_48 = (buffer<char> *)
               write_int_noinline<char,fmt::v8::appender,unsigned_int>
                         (in_RDI.container,in_RCX,in_RDX.container,loc_00);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_48;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const basic_format_specs<Char>& specs,
                         locale_ref loc = {}) -> OutputIt {
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<int>(value), specs, loc);
}